

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O3

la_base85_decode_result la_base85_decode(char *str,char *end)

{
  uint8_t *ptr;
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  uint8_t uVar4;
  uint uVar5;
  size_t nmemb;
  uint uVar6;
  uint8_t uVar7;
  uint uVar8;
  uint8_t uVar9;
  uint uVar10;
  la_base85_decode_result lVar11;
  
  uVar2 = SUB168(SEXT816((long)end - (long)str) * SEXT816(0x6666666666666667),8);
  nmemb = ((uVar2 >> 1) - ((long)uVar2 >> 0x3f)) * 4 + 0x10;
  ptr = (uint8_t *)
        la_xcalloc(nmemb,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                   ,0x5c,"la_base85_decode");
  uVar2 = 0;
  do {
    if ((long)end - (long)str < 5) {
      if (*str != 'z') {
        lVar11._8_8_ = uVar2 & 0xffffffff;
        lVar11.buf = ptr;
        return lVar11;
      }
LAB_00154730:
      uVar4 = '\0';
      lVar1 = 1;
      uVar9 = '\0';
      uVar7 = '\0';
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      if (*str == 'z') goto LAB_00154730;
      lVar1 = 0;
      uVar8 = 0;
      uVar10 = 0;
      uVar6 = 0;
      pcVar3 = str;
      do {
        uVar5 = (uVar5 & 0xff | (uVar8 & 0xff) << 8 | (uVar10 & 0xff) << 0x10 | uVar6 << 0x18) +
                (*pcVar3 + -0x21) * *(int *)((long)la_base85_decode::base85 + lVar1);
        uVar8 = uVar5 >> 8;
        uVar7 = (uint8_t)(uVar5 >> 8);
        uVar10 = uVar5 >> 0x10;
        uVar9 = (uint8_t)(uVar5 >> 0x10);
        uVar6 = uVar5 >> 0x18;
        uVar4 = (uint8_t)(uVar5 >> 0x18);
        pcVar3 = pcVar3 + 1;
        lVar1 = lVar1 + 4;
      } while (lVar1 != 0x14);
      lVar1 = 5;
    }
    if (nmemb <= uVar2 + 5) {
      nmemb = nmemb + (nmemb + 5 >> 2) + 5;
      ptr = (uint8_t *)
            la_xrealloc(ptr,nmemb,
                        "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                        ,0x7b,"la_base85_decode");
    }
    str = str + lVar1;
    ptr[uVar2] = uVar4;
    ptr[uVar2 + 1] = uVar9;
    ptr[uVar2 + 2] = uVar7;
    ptr[uVar2 + 3] = (uint8_t)uVar5;
    uVar2 = uVar2 + 4;
  } while( true );
}

Assistant:

static la_base85_decode_result la_base85_decode(char const *str, char const *end) {
	static uint32_t const base85[] = {
		85 * 85 * 85 * 85,
		85 * 85 * 85,
		85 * 85,
		85,
		1
	};
	la_assert(str != NULL);
	la_assert(str < end);

	// A rough approximation of the output buffer size needed.
	// Five base85 digits encode a single 32-bit word
	// Allow four extra words for potential 'z' occurrences
	// (all-zero word encoded with a single character)
	size_t outsize = ((end - str) / 5 + 4) * 4;
	la_debug_print(D_INFO, "approx outsize: %zu\n", outsize);
	uint8_t *out = LA_XCALLOC(outsize, sizeof(uint8_t));

	char const *ptr = str;
	size_t inpos = 0, outpos = 0;
	union {
		uint32_t val;
		struct {
#ifdef IS_BIG_ENDIAN
			uint8_t b3,b2,b1,b0;
#else
			uint8_t b0,b1,b2,b3;
#endif
		} b;
	} v;

	while(end - ptr >= 5 || *ptr == 'z') {
		v.val = 0;
		if(*ptr == 'z') {
			ptr++;
			inpos++;
		} else {
			for(int i = 0; i < 5; i++, inpos++, ptr++) {
				// shall we reject 'z' inside the 5-digit group?
				v.val += (*ptr - 0x21) * base85[i];
			}
		}
		if(LA_UNLIKELY(outpos + 5 >= outsize)) {
			// grow the buffer by 25 percent, but not less than 5 elements
			outsize += 5;
			outsize += outsize / 4;
			la_debug_print(D_INFO, "outbuf too small; resizing to %zu elements\n", outsize);
			out = LA_XREALLOC(out, outsize * sizeof(uint8_t));
		}
		out[outpos++] = v.b.b3;
		out[outpos++] = v.b.b2;
		out[outpos++] = v.b.b1;
		out[outpos++] = v.b.b0;
	}
	if(ptr != end) {
		la_debug_print(D_ERROR, "Input truncated, %td bytes left\n", end - ptr);
	}
	return (la_base85_decode_result){
		.buf = out,
		.len = outpos
	};
}